

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

int AlphaComparator(AttVal *one,AttVal *two,ctmbstr *list)

{
  int iVar1;
  int iVar2;
  int twoIndex;
  int oneIndex;
  ctmbstr *list_local;
  AttVal *two_local;
  AttVal *one_local;
  
  iVar1 = indexof(one->attribute,list);
  iVar2 = indexof(two->attribute,list);
  if ((iVar1 < 0) || (iVar2 < 0)) {
    if ((iVar1 < 0) || (iVar2 != -1)) {
      if ((iVar1 == -1) && (-1 < iVar2)) {
        one_local._4_4_ = 1;
      }
      else {
        one_local._4_4_ = prvTidytmbstrcmp(one->attribute,two->attribute);
      }
    }
    else {
      one_local._4_4_ = -1;
    }
  }
  else {
    one_local._4_4_ = 1;
    if (iVar1 < iVar2) {
      one_local._4_4_ = -1;
    }
  }
  return one_local._4_4_;
}

Assistant:

static
int AlphaComparator(AttVal *one, AttVal *two, ctmbstr *list)
{
    int oneIndex = indexof( one->attribute, list );
    int twoIndex = indexof( two->attribute, list );

    /* If both on the list, the lower index has priority. */
    if ( oneIndex >= 0 && twoIndex >= 0 )
        return oneIndex < twoIndex ? -1 : 1;

    /* If A on the list but B not on the list, then A has priority. */
    if ( oneIndex >= 0 && twoIndex == -1 )
        return -1;

    /* If A not on the list but B is on the list, then B has priority. */
    if ( oneIndex == -1 && twoIndex >= 0 )
        return 1;

    /* Otherwise nothing is on the list, so just compare strings. */
    return TY_(tmbstrcmp)(one->attribute, two->attribute);
}